

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.cpp
# Opt level: O0

void __thiscall
Vault::Client::Client(Client *this,Config *config,AuthenticationStrategy *authStrategy)

{
  bool bVar1;
  AuthenticationResponse *pAVar2;
  undefined1 local_128 [8];
  optional<Vault::AuthenticationResponse> result;
  AuthenticationStrategy *authStrategy_local;
  Config *config_local;
  Client *this_local;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_0026d970;
  bVar1 = Config::getDebug(config);
  this->debug_ = bVar1;
  bVar1 = Config::getTls(config);
  this->tls_ = bVar1;
  Config::getHost_abi_cxx11_(&this->host_,config);
  Config::getPort_abi_cxx11_(&this->port_,config);
  Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&this->token_);
  Config::getNamespace_abi_cxx11_(&this->namespace_,config);
  Config::Config((Config *)
                 &result.super__Optional_base<Vault::AuthenticationResponse,_false,_false>.
                  _M_payload.
                  super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
                  super__Optional_payload_base<Vault::AuthenticationResponse>._M_engaged,config);
  HttpClient::HttpClient
            (&this->httpClient_,
             (Config *)
             &result.super__Optional_base<Vault::AuthenticationResponse,_false,_false>._M_payload.
              super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
              super__Optional_payload_base<Vault::AuthenticationResponse>._M_engaged);
  Config::~Config((Config *)
                  &result.super__Optional_base<Vault::AuthenticationResponse,_false,_false>.
                   _M_payload.
                   super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
                   super__Optional_payload_base<Vault::AuthenticationResponse>._M_engaged);
  this->authStrategy_ = authStrategy;
  Config::getCaBundle_abi_cxx11_(&this->caBundle_,config);
  (*this->authStrategy_->_vptr_AuthenticationStrategy[2])(local_128);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_128);
  if (bVar1) {
    pAVar2 = std::optional<Vault::AuthenticationResponse>::value
                       ((optional<Vault::AuthenticationResponse> *)local_128);
    Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&this->token_,&pAVar2->token);
  }
  std::optional<Vault::AuthenticationResponse>::~optional
            ((optional<Vault::AuthenticationResponse> *)local_128);
  return;
}

Assistant:

Vault::Client::Client(Vault::Config &config,
                      AuthenticationStrategy &authStrategy)
    : debug_(config.getDebug())
    , tls_(config.getTls())
    , host_(config.getHost())
    , port_(config.getPort())
    , namespace_(config.getNamespace())
    , httpClient_(HttpClient(config))
    , authStrategy_(authStrategy)
    , caBundle_(config.getCaBundle()) {
  if (auto result = authStrategy_.authenticate(*this)) {
    token_ = result.value().token;
  }
}